

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O3

void __thiscall CBinds::OnConsoleInit(CBinds *this)

{
  IKernel *pIVar1;
  IConsole *pIVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  
  pIVar1 = (((this->super_CComponent).m_pClient)->super_IGameClient).super_IInterface.m_pKernel;
  iVar3 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"config");
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 0x38))(plVar4,ConfigSaveCallback,this);
  }
  pIVar2 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"bind","s[key] r[command]",2,ConBind,this,"Bind key to execute the command");
  pIVar2 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"unbind","s[key]",2,ConUnbind,this,"Unbind key");
  pIVar2 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"unbindall","",2,ConUnbindAll,this,"Unbind all keys");
  pIVar2 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"binds","?s[key]",2,ConBinds,this,"Show list of key bindings");
  SetDefaults(this);
  return;
}

Assistant:

void CBinds::OnConsoleInit()
{
	// bindings
	IConfigManager *pConfigManager = Kernel()->RequestInterface<IConfigManager>();
	if(pConfigManager)
		pConfigManager->RegisterCallback(ConfigSaveCallback, this);

	Console()->Register("bind", "s[key] r[command]", CFGFLAG_CLIENT, ConBind, this, "Bind key to execute the command");
	Console()->Register("unbind", "s[key]", CFGFLAG_CLIENT, ConUnbind, this, "Unbind key");
	Console()->Register("unbindall", "", CFGFLAG_CLIENT, ConUnbindAll, this, "Unbind all keys");
	Console()->Register("binds", "?s[key]", CFGFLAG_CLIENT, ConBinds, this, "Show list of key bindings");

	// default bindings
	SetDefaults();
}